

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageSorters.h
# Opt level: O0

bool __thiscall FIX::message_order::operator()(message_order *this,int x,int y)

{
  int *order;
  int y_local;
  int x_local;
  message_order *this_local;
  
  switch(*(undefined4 *)this) {
  case 0:
    this_local._7_1_ = header_order::compare(x,y);
    break;
  case 1:
    this_local._7_1_ = trailer_order::compare(x,y);
    break;
  case 2:
  default:
    this_local._7_1_ = x < y;
    break;
  case 3:
    order = shared_array::operator_cast_to_int_((shared_array *)(this + 8));
    this_local._7_1_ = group_order::compare(x,y,order,*(int *)(this + 0x18));
  }
  return this_local._7_1_;
}

Assistant:

bool operator()(const int x, const int y) const {
    switch (m_mode) {
    case header:
      return header_order::compare(x, y);
    case trailer:
      return trailer_order::compare(x, y);
    case group:
      return group_order::compare(x, y, m_groupOrder, m_largest);
    case normal:
    default:
      return x < y;
    }
  }